

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

InputVertexId __thiscall S2Builder::AddVertex(S2Builder *this,S2Point *v)

{
  pointer *ppVVar1;
  double *pdVar2;
  double dVar3;
  iterator __position;
  VType VVar4;
  long lVar5;
  double *ap;
  
  __position._M_current =
       (this->input_vertices_).
       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((((this->input_vertices_).
        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != __position._M_current) &&
      (v->c_[0] == __position._M_current[-1].c_[0])) &&
     (!NAN(v->c_[0]) && !NAN(__position._M_current[-1].c_[0]))) {
    lVar5 = 0;
    do {
      if (lVar5 == 0x10) goto LAB_001ab737;
      dVar3 = *(double *)((long)v->c_ + lVar5 + 8);
      pdVar2 = (double *)((long)(__position._M_current)->c_ + lVar5 + -0x10);
      lVar5 = lVar5 + 8;
    } while ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2)));
  }
  if (__position._M_current ==
      (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
    _M_realloc_insert<Vector3<double>const&>
              ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->input_vertices_,
               __position,v);
  }
  else {
    (__position._M_current)->c_[2] = v->c_[2];
    VVar4 = v->c_[1];
    (__position._M_current)->c_[0] = v->c_[0];
    (__position._M_current)->c_[1] = VVar4;
    ppVVar1 = &(this->input_vertices_).
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
LAB_001ab737:
  return (int)((ulong)((long)(this->input_vertices_).
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->input_vertices_).
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
}

Assistant:

S2Builder::InputVertexId S2Builder::AddVertex(const S2Point& v) {
  // Remove duplicate vertices that follow the pattern AB, BC, CD.  If we want
  // to do anything more sophisticated, either use a ValueLexicon, or sort the
  // vertices once they have all been added, remove duplicates, and update the
  // edges.
  if (input_vertices_.empty() || v != input_vertices_.back()) {
    input_vertices_.push_back(v);
  }
  return input_vertices_.size() - 1;
}